

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::Context(Context *this,int argc,char **argv)

{
  char *pcVar1;
  int in_ESI;
  String *in_RDI;
  undefined1 in_stack_0000023f;
  char **in_stack_00000240;
  int in_stack_0000024c;
  Context *in_stack_00000250;
  String *this_00;
  ContextState *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  pcVar1 = (char *)operator_new(0x1168);
  detail::ContextState::ContextState(in_stack_ffffffffffffffc0);
  (in_RDI->field_0).data.ptr = pcVar1;
  parseArgs(in_stack_00000250,in_stack_0000024c,in_stack_00000240,(bool)in_stack_0000023f);
  if (in_ESI != 0) {
    String::String(this_00,(char *)in_RDI);
    String::operator=(this_00,in_RDI);
    String::~String(this_00);
  }
  return;
}

Assistant:

Context::Context(int argc, const char* const* argv)
        : p(new detail::ContextState) {
    parseArgs(argc, argv, true);
    if(argc)
        p->binary_name = argv[0];
}